

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O1

int Abc_ObjSopSimulate(Abc_Obj_t *pObj)

{
  char *pcVar1;
  byte bVar2;
  char *pSop;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  pSop = (char *)(pObj->field_5).pData;
  if ((pSop == (char *)0x0) || (iVar3 = Abc_SopIsExorType(pSop), iVar3 != 0)) {
    __assert_fail("pSop && !Abc_SopIsExorType(pSop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retInit.c"
                  ,0x61,"int Abc_ObjSopSimulate(Abc_Obj_t *)");
  }
  iVar3 = Abc_SopGetVarNum(pSop);
  if (*pSop == '\0') {
    uVar8 = 0;
LAB_0045612d:
    iVar3 = Abc_SopGetPhase(pSop);
    return iVar3 == 0 ^ uVar8;
  }
  uVar8 = 0;
  pcVar4 = pSop;
LAB_004560bb:
  uVar5 = 1;
  lVar6 = 0;
  do {
    bVar2 = pcVar4[lVar6];
    if (bVar2 < 0x31) {
      if (bVar2 == 0x30) {
        uVar7 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]] + 0x40) ^ 1
        ;
LAB_0045610b:
        uVar5 = uVar5 & uVar7;
      }
      else if ((bVar2 == 0) || (bVar2 == 0x20)) break;
    }
    else if (bVar2 == 0x31) {
      uVar7 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]] + 0x40);
      goto LAB_0045610b;
    }
    lVar6 = lVar6 + 1;
  } while( true );
  uVar8 = uVar8 | uVar5;
  pcVar1 = pcVar4 + (iVar3 + 3);
  pcVar4 = pcVar4 + (iVar3 + 3);
  if (*pcVar1 == '\0') goto LAB_0045612d;
  goto LAB_004560bb;
}

Assistant:

int Abc_ObjSopSimulate( Abc_Obj_t * pObj )
{
    char * pCube, * pSop = (char *)pObj->pData;
    int nVars, Value, v, ResOr, ResAnd, ResVar;
    assert( pSop && !Abc_SopIsExorType(pSop) );
    // simulate the SOP of the node
    ResOr = 0;
    nVars = Abc_SopGetVarNum(pSop);
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        ResAnd = 1;
        Abc_CubeForEachVar( pCube, Value, v )
        {
            if ( Value == '0' )
                ResVar = 1 ^ ((int)(ABC_PTRUINT_T)Abc_ObjFanin(pObj, v)->pCopy);
            else if ( Value == '1' )
                ResVar = (int)(ABC_PTRUINT_T)Abc_ObjFanin(pObj, v)->pCopy;
            else
                continue;
            ResAnd &= ResVar;
        }
        ResOr |= ResAnd;
    }
    // complement the result if necessary
    if ( !Abc_SopGetPhase(pSop) )
        ResOr ^= 1;
    return ResOr;
}